

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

NumericExpr __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
::ReadNumericExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>_>_>
                  *this,int opcode)

{
  Kind KVar1;
  BinaryReader<mp::internal::EndiannessConverter> *pBVar2;
  char *pcVar3;
  CountExpr CVar4;
  int iVar5;
  AssertionFailure *this_00;
  NumberOfArgHandler args;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  local_28.field_1.values_ = (Value *)&local_38;
  if (0x52 < (uint)opcode) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(this_00,"invalid opcode");
    __cxa_throw(this_00,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
  }
  KVar1 = OpCodeInfo::INFO[(uint)opcode].first_kind;
  switch(KVar1) {
  case IF:
    ReadLogicalExpr(this);
LAB_001c5503:
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
    goto LAB_001c5521;
  case PLTERM:
    iVar5 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
    if (iVar5 < 2) {
      local_38 = 0;
      uStack_30 = 0;
      local_28.types_ = 0;
      local_28.field_1.values_ = (Value *)&local_38;
      BinaryReaderBase::ReportError
                (&this->reader_->super_BinaryReaderBase,(CStringRef)0x25fc0a,&local_28);
    }
    iVar5 = iVar5 + -1;
    do {
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      ReadConstant(this,*pcVar3);
      pBVar2 = this->reader_;
      pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
      (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
      ReadConstant(this,*pcVar3);
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadConstant(this,*pcVar3);
    ReadReference(this);
    break;
  case CALL:
  case LAST_VARARG:
switchD_001c54c5_caseD_29:
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x262f3a,&local_28);
  case FIRST_ITERATED:
    iVar5 = ReadNumArgs(this,1);
    if (0 < iVar5) {
      do {
        pBVar2 = this->reader_;
        pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
        ReadNumericExpr(this,*pcVar3,false);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    break;
  case SUM:
    iVar5 = ReadNumArgs(this,3);
    if (0 < iVar5) {
      do {
        pBVar2 = this->reader_;
        pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
        (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
        ReadNumericExpr(this,*pcVar3,false);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    break;
  case LAST_ITERATED:
    iVar5 = ReadNumArgs(this,1);
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
    ::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>::NumericExprReader,mp::NLHandler<mp::NullNLHandler<BasicTestExpr<0>>,BasicTestExpr<0>>::ArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<testing::NiceMock<MockNLHandler>>>
                *)this,iVar5 + -1,(ArgHandler *)&local_38);
    break;
  case NUMBEROF_SYM:
    iVar5 = ReadNumArgs(this,1);
    ReadSymbolicExpr(this);
    if (1 < iVar5) {
      iVar5 = iVar5 + -1;
      do {
        ReadSymbolicExpr(this);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    break;
  case COUNT:
    CVar4 = ReadCountExpr(this);
    return (NumericExpr)CVar4.id_;
  default:
    if (KVar1 == ADD) goto LAB_001c5503;
    if (KVar1 != FIRST_UNARY) goto switchD_001c54c5_caseD_29;
LAB_001c5521:
    pBVar2 = this->reader_;
    pcVar3 = (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar3;
    (pBVar2->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar3 + 1;
    ReadNumericExpr(this,*pcVar3,false);
  }
  return (NumericExpr)NULL_ID;
}

Assistant:

fmt::StringRef ReadString() {
    int length = ReadUInt();
    return fmt::StringRef(length != 0 ? Read(length) : 0, length);
  }